

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolutionNeighbourhood.cpp
# Opt level: O3

void __thiscall SolutionNeighbourhood::undoLastMove(SolutionNeighbourhood *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  Solution *pSVar3;
  pointer pcVar4;
  pointer ppTVar5;
  pointer ppTVar6;
  int iVar7;
  vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
  *pvVar8;
  Position *pPVar9;
  Turn *pTVar10;
  ShiftType *pSVar11;
  string *psVar12;
  string *psVar13;
  NurseSolution *pNVar14;
  NurseSolution *ns2;
  vector<Turn_*,_std::allocator<Turn_*>_> *__range2;
  pointer ppTVar15;
  pointer ppTVar16;
  Move *pMVar17;
  Turn *unaff_R15;
  vector<Turn_*,_std::allocator<Turn_*>_> day1;
  vector<Turn_*,_std::allocator<Turn_*>_> day2;
  vector<Turn_*,_std::allocator<Turn_*>_> local_78;
  vector<Turn_*,_std::allocator<Turn_*>_> local_58;
  Turn *local_38;
  
  if (this->lastMove == (Move *)0x0) {
    return;
  }
  local_78.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_78.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_78.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_58.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_58.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  iVar7 = Move::getMoveType(this->lastMove);
  if (iVar7 == 0) {
    pvVar8 = Solution::getTurns(this->solution);
    pPVar9 = Move::getLastPosition(this->lastMove);
    iVar7 = Position::getDay(pPVar9);
    std::vector<Turn_*,_std::allocator<Turn_*>_>::operator=
              (&local_78,
               (pvVar8->
               super__Vector_base<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + iVar7);
    ppTVar5 = local_78.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppTVar16 = local_78.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                    super__Vector_impl_data._M_start; ppTVar16 != ppTVar5; ppTVar16 = ppTVar16 + 1)
    {
      pTVar10 = *ppTVar16;
      pSVar11 = Turn::getShiftType(pTVar10);
      psVar12 = ShiftType::getId_abi_cxx11_(pSVar11);
      pPVar9 = Move::getLastPosition(this->lastMove);
      pSVar11 = Position::getShiftType(pPVar9);
      psVar13 = ShiftType::getId_abi_cxx11_(pSVar11);
      sVar2 = psVar12->_M_string_length;
      if ((sVar2 == psVar13->_M_string_length) &&
         ((sVar2 == 0 ||
          (iVar7 = bcmp((psVar12->_M_dataplus)._M_p,(psVar13->_M_dataplus)._M_p,sVar2), iVar7 == 0))
         )) {
        psVar12 = Turn::getSkill_abi_cxx11_(pTVar10);
        pPVar9 = Move::getLastPosition(this->lastMove);
        psVar13 = Position::getSkill_abi_cxx11_(pPVar9);
        sVar2 = psVar12->_M_string_length;
        if ((sVar2 == psVar13->_M_string_length) &&
           ((sVar2 == 0 ||
            (iVar7 = bcmp((psVar12->_M_dataplus)._M_p,(psVar13->_M_dataplus)._M_p,sVar2), iVar7 == 0
            )))) {
          pSVar3 = this->solution;
          pNVar14 = Move::getMovedNurse(this->lastMove);
          Solution::removeNurseFromTurn(pSVar3,pNVar14,pTVar10);
          pMVar17 = this->lastMove;
          if (pMVar17 != (Move *)0x0) goto LAB_0011627e;
          goto LAB_001163e4;
        }
      }
    }
LAB_00116271:
    pMVar17 = this->lastMove;
    if (pMVar17 != (Move *)0x0) {
LAB_0011627e:
      pcVar4 = (pMVar17->lastPosition).skill._M_dataplus._M_p;
      paVar1 = &(pMVar17->lastPosition).skill.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar4 != paVar1) {
        operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
      }
      pcVar4 = (pMVar17->initialPosition).skill._M_dataplus._M_p;
      paVar1 = &(pMVar17->initialPosition).skill.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar4 != paVar1) {
        operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
      }
      goto LAB_001163e4;
    }
  }
  else {
    if (iVar7 == 1) {
      pvVar8 = Solution::getTurns(this->solution);
      pPVar9 = Move::getInitialPosition(this->lastMove);
      iVar7 = Position::getDay(pPVar9);
      std::vector<Turn_*,_std::allocator<Turn_*>_>::operator=
                (&local_78,
                 (pvVar8->
                 super__Vector_base<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + iVar7);
      ppTVar5 = local_78.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (ppTVar16 = local_78.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                      super__Vector_impl_data._M_start; ppTVar16 != ppTVar5; ppTVar16 = ppTVar16 + 1
          ) {
        pTVar10 = *ppTVar16;
        pSVar11 = Turn::getShiftType(pTVar10);
        psVar12 = ShiftType::getId_abi_cxx11_(pSVar11);
        pPVar9 = Move::getInitialPosition(this->lastMove);
        pSVar11 = Position::getShiftType(pPVar9);
        psVar13 = ShiftType::getId_abi_cxx11_(pSVar11);
        sVar2 = psVar12->_M_string_length;
        if ((sVar2 == psVar13->_M_string_length) &&
           ((sVar2 == 0 ||
            (iVar7 = bcmp((psVar12->_M_dataplus)._M_p,(psVar13->_M_dataplus)._M_p,sVar2), iVar7 == 0
            )))) {
          psVar12 = Turn::getSkill_abi_cxx11_(pTVar10);
          pPVar9 = Move::getInitialPosition(this->lastMove);
          psVar13 = Position::getSkill_abi_cxx11_(pPVar9);
          sVar2 = psVar12->_M_string_length;
          if ((sVar2 == psVar13->_M_string_length) &&
             ((sVar2 == 0 ||
              (iVar7 = bcmp((psVar12->_M_dataplus)._M_p,(psVar13->_M_dataplus)._M_p,sVar2),
              iVar7 == 0)))) {
            pNVar14 = Move::getMovedNurse(this->lastMove);
            NurseSolution::addTurn(pNVar14,pTVar10);
            goto LAB_001163f9;
          }
        }
      }
      goto LAB_00116271;
    }
    if (iVar7 != 2) goto LAB_00116271;
    pvVar8 = Solution::getTurns(this->solution);
    pPVar9 = Move::getInitialPosition(this->lastMove);
    iVar7 = Position::getDay(pPVar9);
    std::vector<Turn_*,_std::allocator<Turn_*>_>::operator=
              (&local_78,
               (pvVar8->
               super__Vector_base<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + iVar7);
    pTVar10 = (Turn *)Solution::getTurns(this->solution);
    pPVar9 = Move::getLastPosition(this->lastMove);
    iVar7 = Position::getDay(pPVar9);
    std::vector<Turn_*,_std::allocator<Turn_*>_>::operator=
              (&local_58,
               (vector<Turn_*,_std::allocator<Turn_*>_> *)((long)iVar7 * 0x18 + *(long *)pTVar10));
    ppTVar5 = local_78.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppTVar16 = local_78.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
        ppTVar6 = local_58.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                  super__Vector_impl_data._M_finish,
        ppTVar15 = local_58.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                   super__Vector_impl_data._M_start, local_38 = pTVar10, ppTVar16 != ppTVar5;
        ppTVar16 = ppTVar16 + 1) {
      unaff_R15 = *ppTVar16;
      pSVar11 = Turn::getShiftType(unaff_R15);
      psVar12 = ShiftType::getId_abi_cxx11_(pSVar11);
      pPVar9 = Move::getInitialPosition(this->lastMove);
      pSVar11 = Position::getShiftType(pPVar9);
      psVar13 = ShiftType::getId_abi_cxx11_(pSVar11);
      sVar2 = psVar12->_M_string_length;
      if ((sVar2 == psVar13->_M_string_length) &&
         ((sVar2 == 0 ||
          (iVar7 = bcmp((psVar12->_M_dataplus)._M_p,(psVar13->_M_dataplus)._M_p,sVar2), iVar7 == 0))
         )) {
        psVar12 = Turn::getSkill_abi_cxx11_(unaff_R15);
        pPVar9 = Move::getInitialPosition(this->lastMove);
        psVar13 = Position::getSkill_abi_cxx11_(pPVar9);
        sVar2 = psVar12->_M_string_length;
        if ((sVar2 == psVar13->_M_string_length) &&
           ((sVar2 == 0 ||
            (iVar7 = bcmp((psVar12->_M_dataplus)._M_p,(psVar13->_M_dataplus)._M_p,sVar2), iVar7 == 0
            )))) {
          pTVar10 = unaff_R15;
        }
      }
    }
    for (; ppTVar15 != ppTVar6; ppTVar15 = ppTVar15 + 1) {
      pTVar10 = *ppTVar15;
      pSVar11 = Turn::getShiftType(pTVar10);
      psVar12 = ShiftType::getId_abi_cxx11_(pSVar11);
      pPVar9 = Move::getLastPosition(this->lastMove);
      pSVar11 = Position::getShiftType(pPVar9);
      psVar13 = ShiftType::getId_abi_cxx11_(pSVar11);
      sVar2 = psVar12->_M_string_length;
      if ((sVar2 == psVar13->_M_string_length) &&
         ((sVar2 == 0 ||
          (iVar7 = bcmp((psVar12->_M_dataplus)._M_p,(psVar13->_M_dataplus)._M_p,sVar2), iVar7 == 0))
         )) {
        psVar12 = Turn::getSkill_abi_cxx11_(pTVar10);
        pPVar9 = Move::getLastPosition(this->lastMove);
        psVar13 = Position::getSkill_abi_cxx11_(pPVar9);
        sVar2 = psVar12->_M_string_length;
        if ((sVar2 == psVar13->_M_string_length) &&
           ((sVar2 == 0 ||
            (iVar7 = bcmp((psVar12->_M_dataplus)._M_p,(psVar13->_M_dataplus)._M_p,sVar2), iVar7 == 0
            )))) {
          unaff_R15 = pTVar10;
        }
      }
    }
    pSVar3 = this->solution;
    pNVar14 = Move::getMovedNurse(this->lastMove);
    ns2 = Move::getTradedNurse(this->lastMove);
    Solution::atomicSwitchNurseTurns(pSVar3,pNVar14,unaff_R15,ns2,local_38);
    pMVar17 = this->lastMove;
    if (pMVar17 != (Move *)0x0) {
      pcVar4 = (pMVar17->lastPosition).skill._M_dataplus._M_p;
      paVar1 = &(pMVar17->lastPosition).skill.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar4 != paVar1) {
        operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
      }
      pcVar4 = (pMVar17->initialPosition).skill._M_dataplus._M_p;
      paVar1 = &(pMVar17->initialPosition).skill.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar4 != paVar1) {
        operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
      }
    }
    operator_delete(pMVar17,0x70);
    this->lastMove = (Move *)0x0;
  }
  pMVar17 = (Move *)0x0;
LAB_001163e4:
  operator_delete(pMVar17,0x70);
  this->lastMove = (Move *)0x0;
LAB_001163f9:
  if (local_58.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SolutionNeighbourhood::undoLastMove(){
    if(lastMove == nullptr)
        return;
    vector<Turn*> day1 , day2;
    switch (lastMove->getMoveType())
    {
        case 0:
            //insert so we have to remove
            day1 = solution->getTurns()[lastMove->getLastPosition().getDay()];
            for(Turn* turn : day1)
            {
                if(turn->getShiftType()->getId() == lastMove->getLastPosition().getShiftType()->getId() && turn->getSkill() == lastMove->getLastPosition().getSkill()) {
                    solution->removeNurseFromTurn(lastMove->getMovedNurse(),turn);
                    delete lastMove;
                    lastMove = nullptr;
                    return;
                }
            }
            break;
        case 1:
            //remove so we have to insert
            day1 = solution->getTurns()[lastMove->getInitialPosition().getDay()];
            for(Turn* turn : day1)
            {
                if(turn->getShiftType()->getId() == lastMove->getInitialPosition().getShiftType()->getId() && turn->getSkill() == lastMove->getInitialPosition().getSkill()){
                    lastMove->getMovedNurse()->addTurn(turn);
                return;
                }
            }
            break;
        case 2:
            //trade so we have to do the inverse, so 2 to 1, and 1 to 2
            day1 = solution->getTurns()[lastMove->getInitialPosition().getDay()];
            day2 = solution->getTurns()[lastMove->getLastPosition().getDay()];

            Turn* initialTurn;
            Turn* lastTurn;

            for(Turn* turn : day1)
            {
                if(turn->getShiftType()->getId() == lastMove->getInitialPosition().getShiftType()->getId() && turn->getSkill() == lastMove->getInitialPosition().getSkill())
                    initialTurn = turn;
            }
            for(Turn* turn : day2)
            {
                if(turn->getShiftType()->getId() == lastMove->getLastPosition().getShiftType()->getId() && turn->getSkill() == lastMove->getLastPosition().getSkill())
                    lastTurn = turn;
            }

            //atomicSwitchNurseTurns, invert what lastMove did
            //NS1 / LastPosition / NS2 / InitialPosition
            solution->atomicSwitchNurseTurns(lastMove->getMovedNurse(),lastTurn,lastMove->getTradedNurse(),initialTurn);
            //if(!solution->atomicSwitchNurseTurns(lastMove->getMovedNurse(),lastTurn,lastMove->getTradedNurse(),initialTurn))
                //cout << "ERRO" << endl;
            delete lastMove;
            lastMove = nullptr;
            break;
    }

    delete lastMove;
    lastMove = nullptr;
}